

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

int N_VLinearSumVectorArray(int nvec,realtype a,N_Vector *X,realtype b,N_Vector *Y,N_Vector *Z)

{
  _func_int_int_realtype_N_Vector_ptr_realtype_N_Vector_ptr_N_Vector_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  
  UNRECOVERED_JUMPTABLE = (*Z)->ops->nvlinearsumvectorarray;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_int_int_realtype_N_Vector_ptr_realtype_N_Vector_ptr_N_Vector_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,a,X,b,Y,Z);
    return iVar1;
  }
  if (0 < nvec) {
    uVar2 = 0;
    do {
      (*(*Z)->ops->nvlinearsum)(a,X[uVar2],b,Y[uVar2],Z[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)nvec != uVar2);
  }
  return 0;
}

Assistant:

int N_VLinearSumVectorArray(int nvec, realtype a, N_Vector* X,
                            realtype b, N_Vector* Y, N_Vector* Z)
{
  int i;

  if (Z[0]->ops->nvlinearsumvectorarray != NULL) {
    
    return(Z[0]->ops->nvlinearsumvectorarray(nvec, a, X, b, Y, Z));

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvlinearsum(a, X[i], b, Y[i], Z[i]);
    }
    return(0);

  }
}